

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

void __thiscall
gl4cts::TextureViewTestBaseAndMaxLevels::initTextures(TextureViewTestBaseAndMaxLevels *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  void *pvVar6;
  uint uVar7;
  uint y;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint n_component;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_result_to_id);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_to_id);
  (**(code **)(lVar5 + 0x6f8))(1,&this->m_view_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glGenTextures() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2571);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2575);
  (**(code **)(lVar5 + 0x1380))
            (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexStorage2D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2578);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813c,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x257c);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813d,4);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x2580);
  uVar12 = 0;
  while (uVar12 < this->m_texture_n_levels) {
    uVar1 = uVar12 + 1;
    auVar14._0_4_ =
         ((float)(uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar12 & 0xffff | 0x4b000000);
    auVar14._4_4_ =
         ((float)(uVar1 >> 0x10 | 0x53000000) - 5.497642e+11) + (float)(uVar1 & 0xffff | 0x4b000000)
    ;
    auVar14._8_4_ =
         ((float)(uVar12 + 2 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar12 + 2 & 0xffff | 0x4b000000);
    auVar14._12_4_ =
         ((float)(uVar12 + 3 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(uVar12 + 3 & 0xffff | 0x4b000000);
    local_48 = divps(auVar14,_DAT_016ecf00);
    auVar15._0_4_ =
         ((float)(10 - uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(10 - uVar12 & 0xffff | 0x4b000000);
    auVar15._4_4_ =
         ((float)(9 - uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(9 - uVar12 & 0xffff | 0x4b000000);
    auVar15._8_4_ =
         ((float)(8 - uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(8 - uVar12 & 0xffff | 0x4b000000);
    auVar15._12_4_ =
         ((float)(7 - uVar12 >> 0x10 | 0x53000000) - 5.497642e+11) +
         (float)(7 - uVar12 & 0xffff | 0x4b000000);
    local_58 = divps(auVar15,_DAT_016ecf00);
    uVar2 = this->m_texture_n_components;
    uVar9 = this->m_texture_height >> ((byte)uVar12 & 0x1f);
    uVar13 = this->m_texture_width >> ((byte)uVar12 & 0x1f);
    pvVar6 = operator_new__((ulong)(uVar2 * uVar13 * uVar9));
    uVar7 = 0;
    for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
      for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
        fVar16 = (float)(uVar10 & 0xffffffff) / (float)uVar13;
        for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
          *(char *)((long)pvVar6 + uVar11 + (ulong)(uint)((int)uVar10 * 4) + (ulong)uVar7) =
               (char)(int)((*(float *)(local_48 + uVar11 * 4) * fVar16 +
                           *(float *)(local_58 + uVar11 * 4) * (1.0 - fVar16)) * 255.0);
        }
      }
      uVar7 = uVar7 + uVar13 * 4;
    }
    (**(code **)(lVar5 + 0x13b8))(0xde1,uVar12,0,0,uVar13,uVar9,0x1908,0x1401,pvVar6);
    operator_delete__(pvVar6);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glTexSubImage2D() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x25b6);
    uVar12 = uVar1;
  }
  (**(code **)(lVar5 + 0x14b0))(this->m_view_to_id,0xde1,this->m_to_id,0x8058,0,5,0,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25be);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_view_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25c2);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813c,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25c5);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x813d,2);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25c9);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_result_to_id);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glBindTexture() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25cd);
  (**(code **)(lVar5 + 0x1380))(0xde1,1,0x8058,this->m_view_width,this->m_view_height);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glTexStorage2D() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x25d1);
  return;
}

Assistant:

void TextureViewTestBaseAndMaxLevels::initTextures()
{
	/* Generate IDs first */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_result_to_id);
	gl.genTextures(1, &m_to_id);
	gl.genTextures(1, &m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed");

	/* Set up parent texture object's storage */
	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");

	/* Configure GL_TEXTURE_BASE_LEVEL parameter of the texture object as per test spec */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname");

	/* Configure GL_TEXTURE_MAX_LEVEL parameter of the texture object as per test spec */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname");

	/* Set up mip-maps */
	for (unsigned int n_mipmap = 0; n_mipmap < m_texture_n_levels; ++n_mipmap)
	{
		const float start_rgba[] = { /* As per test specification */
									 float(n_mipmap + 0) / 10.0f, float(n_mipmap + 1) / 10.0f,
									 float(n_mipmap + 2) / 10.0f, float(n_mipmap + 3) / 10.0f
		};
		const float end_rgba[] = { float(10 - (n_mipmap + 0)) / 10.0f, float(10 - (n_mipmap + 1)) / 10.0f,
								   float(10 - (n_mipmap + 2)) / 10.0f, float(10 - (n_mipmap + 3)) / 10.0f };

		/* Allocate space for the layer data */
		const unsigned int mipmap_height = m_texture_height >> n_mipmap;
		const unsigned int mipmap_width  = m_texture_width >> n_mipmap;
		unsigned char*	 data			 = new unsigned char[mipmap_width * mipmap_height * m_texture_n_components];

		if (data == NULL)
		{
			TCU_FAIL("Out of memory");
		}

		/* Fill the buffer with layer data */
		const unsigned int pixel_size = 4 /* components */;

		for (unsigned int y = 0; y < mipmap_height; ++y)
		{
			unsigned char* row_data_ptr = data + mipmap_width * y * pixel_size;

			for (unsigned int x = 0; x < mipmap_width; ++x)
			{
				const float	lerp_factor	= float(x) / float(mipmap_width);
				unsigned char* pixel_data_ptr = row_data_ptr + x * pixel_size;

				for (unsigned int n_component = 0; n_component < m_texture_n_components; n_component++)
				{
					pixel_data_ptr[n_component] = (unsigned char)((start_rgba[n_component] * lerp_factor +
																   end_rgba[n_component] * (1.0f - lerp_factor)) *
																  255.0f);
				}
			} /* for (all columns) */
		}	 /* for (all rows) */

		/* Upload the layer data */
		gl.texSubImage2D(GL_TEXTURE_2D, n_mipmap, 0, /* xoffset */
						 0,							 /* yoffset */
						 mipmap_width, mipmap_height, GL_RGBA, GL_UNSIGNED_BYTE, data);

		/* Release the data buffer */
		delete[] data;

		data = DE_NULL;

		/* Make sure the API call finished successfully */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexSubImage2D() call failed");
	} /* for (all mip-maps) */

	/* Configure the texture view storage as per spec. */
	gl.textureView(m_view_to_id, GL_TEXTURE_2D, m_to_id, GL_RGBA8, 0, /* minlevel */
				   5,												  /* numlevels */
				   0,												  /* minlayer */
				   1);												  /* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	/* Configure the texture view's GL_TEXTURE_BASE_LEVEL parameter */
	gl.bindTexture(GL_TEXTURE_2D, m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_BASE_LEVEL, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_BASE_LEVEL pname");

	/* Configure the texture view's GL_TEXTURE_MAX_LEVEL parameter */
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAX_LEVEL, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call failed for GL_TEXTURE_MAX_LEVEL pname");

	/* Set up result texture storage */
	gl.bindTexture(GL_TEXTURE_2D, m_result_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* We will only attach the first level of the result texture to the FBO */
					GL_RGBA8, m_view_width, m_view_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed");
}